

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegAtomPtr xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  xmlRegRangePtr pxVar1;
  xmlRegAtomPtr atom_00;
  xmlRegRangePtr *ppxVar2;
  xmlRegRangePtr pxVar3;
  xmlChar *pxVar4;
  long lVar5;
  
  atom_00 = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
  if (atom_00 == (xmlRegAtomPtr)0x0) {
    ctxt->error = 2;
    atom_00 = (xmlRegAtomPtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
  }
  else {
    atom_00->ranges = (xmlRegRangePtr *)0x0;
    atom_00->data = (void *)0x0;
    atom_00->stop = (xmlRegStatePtr)0x0;
    atom_00->maxRanges = 0;
    atom_00->nbRanges = 0;
    atom_00->start = (xmlRegStatePtr)0x0;
    atom_00->start0 = (xmlRegStatePtr)0x0;
    atom_00->valuep2 = (void *)0x0;
    atom_00->neg = 0;
    atom_00->codepoint = 0;
    *(undefined8 *)&atom_00->max = 0;
    atom_00->valuep = (void *)0x0;
    atom_00->no = 0;
    atom_00->type = 0;
    atom_00->quant = 0;
    atom_00->min = 0;
    atom_00->type = atom->type;
    atom_00->quant = atom->quant;
    atom_00->min = atom->min;
    atom_00->max = atom->max;
    if (0 < (long)atom->nbRanges) {
      ppxVar2 = (xmlRegRangePtr *)(*xmlMalloc)((long)atom->nbRanges << 3);
      atom_00->ranges = ppxVar2;
      if (ppxVar2 == (xmlRegRangePtr *)0x0) {
        ctxt->error = 2;
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                            (xmlError *)0x0);
LAB_0017f3d0:
        xmlRegFreeAtom(atom_00);
        atom_00 = (xmlRegAtomPtr)0x0;
      }
      else if (0 < atom->nbRanges) {
        lVar5 = 0;
        do {
          pxVar1 = atom->ranges[lVar5];
          if ((pxVar1 == (xmlRegRangePtr)0x0) ||
             (pxVar3 = xmlRegNewRange(ctxt,pxVar1->neg,pxVar1->type,pxVar1->start,pxVar1->end),
             pxVar3 == (xmlRegRangePtr)0x0)) {
LAB_0017f36a:
            pxVar3 = (xmlRegRangePtr)0x0;
          }
          else if (pxVar1->blockName != (xmlChar *)0x0) {
            pxVar4 = xmlStrdup(pxVar1->blockName);
            pxVar3->blockName = pxVar4;
            if (pxVar4 == (xmlChar *)0x0) {
              ctxt->error = 2;
              xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                  0xe,(xmlError *)0x0);
              if (pxVar3->blockName != (xmlChar *)0x0) {
                (*xmlFree)(pxVar3->blockName);
              }
              (*xmlFree)(pxVar3);
              goto LAB_0017f36a;
            }
          }
          atom_00->ranges[lVar5] = pxVar3;
          if (atom_00->ranges[lVar5] == (xmlRegRangePtr)0x0) goto LAB_0017f3d0;
          lVar5 = lVar5 + 1;
          atom_00->nbRanges = (int)lVar5;
        } while (lVar5 < atom->nbRanges);
      }
    }
  }
  return atom_00;
}

Assistant:

static xmlRegAtomPtr
xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = atom->type;
    ret->quant = atom->quant;
    ret->min = atom->min;
    ret->max = atom->max;
    if (atom->nbRanges > 0) {
        int i;

        ret->ranges = (xmlRegRangePtr *) xmlMalloc(sizeof(xmlRegRangePtr) *
	                                           atom->nbRanges);
	if (ret->ranges == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    goto error;
	}
	for (i = 0;i < atom->nbRanges;i++) {
	    ret->ranges[i] = xmlRegCopyRange(ctxt, atom->ranges[i]);
	    if (ret->ranges[i] == NULL)
	        goto error;
	    ret->nbRanges = i + 1;
	}
    }
    return(ret);

error:
    xmlRegFreeAtom(ret);
    return(NULL);
}